

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,IfStatement *statement)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  allocator<char> local_39;
  key_type local_38;
  IfStatement *local_18;
  IfStatement *statement_local;
  TypeCheckingVisitor *this_local;
  
  local_18 = statement;
  statement_local = (IfStatement *)this;
  iVar2 = TemplateVisitor<int>::Accept
                    ((TemplateVisitor<int> *)this,&statement->expression_->super_Node);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"boolean",&local_39);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->type_system_,&local_38);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (iVar2 != iVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Non-boolean expr in if condition");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  TemplateVisitor<int>::Accept((TemplateVisitor<int> *)this,&local_18->if_statement_->super_Node);
  if (local_18->else_statement_ != (Statement *)0x0) {
    TemplateVisitor<int>::Accept
              ((TemplateVisitor<int> *)this,&local_18->else_statement_->super_Node);
  }
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(IfStatement* statement) {
  if (Accept(statement->expression_) != type_system_["boolean"]) {
    throw std::runtime_error("Non-boolean expr in if condition");
  }

  Accept(statement->if_statement_);

  if (statement->else_statement_) {
    Accept(statement->else_statement_);
  }
}